

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupEx(char *str_id,bool reopen_existing)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  ImGuiID id_00;
  ImGuiID parent_menu_set;
  value_type *pvVar2;
  undefined1 local_58 [8];
  ImGuiPopupRef popup_ref;
  int current_stack_size;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool reopen_existing_local;
  char *str_id_local;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  id_00 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  popup_ref.MousePosOnOpen.y = (float)(pIVar1->CurrentPopupStack).Size;
  popup_ref._36_4_ = id_00;
  parent_menu_set = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
  ImGuiPopupRef::ImGuiPopupRef
            ((ImGuiPopupRef *)local_58,id_00,this,parent_menu_set,&(pIVar1->IO).MousePos);
  if ((pIVar1->OpenPopupStack).Size < (int)popup_ref.MousePosOnOpen.y + 1) {
    ImVector<ImGuiPopupRef>::push_back(&pIVar1->OpenPopupStack,(value_type *)local_58);
  }
  else if ((reopen_existing) ||
          (pvVar2 = ImVector<ImGuiPopupRef>::operator[]
                              (&pIVar1->OpenPopupStack,(int)popup_ref.MousePosOnOpen.y),
          pvVar2->PopupId != popup_ref._36_4_)) {
    ImVector<ImGuiPopupRef>::resize(&pIVar1->OpenPopupStack,(int)popup_ref.MousePosOnOpen.y + 1);
    pvVar2 = ImVector<ImGuiPopupRef>::operator[]
                       (&pIVar1->OpenPopupStack,(int)popup_ref.MousePosOnOpen.y);
    memcpy(pvVar2,local_58,0x24);
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(const char* str_id, bool reopen_existing)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id);
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref = ImGuiPopupRef(id, window, window->GetID("##menus"), g.IO.MousePos); // Tagged as new ref because constructor sets Window to NULL (we are passing the ParentWindow info here)
    if (g.OpenPopupStack.Size < current_stack_size + 1)
        g.OpenPopupStack.push_back(popup_ref);
    else if (reopen_existing || g.OpenPopupStack[current_stack_size].PopupId != id)
    {
        g.OpenPopupStack.resize(current_stack_size+1);
        g.OpenPopupStack[current_stack_size] = popup_ref;
    }
}